

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitPages<false>
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,void *address,
          uint pageCount)

{
  BVIndex BVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  undefined4 *puVar5;
  PageAllocatorBaseCommon *pPVar6;
  PreReservedVirtualAllocWrapper *this_00;
  AllocatorType *pAVar7;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_01;
  
  if (address < (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x229,"(address >= this->address)","address >= this->address");
    if (!bVar3) goto LAB_006fe007;
    *puVar5 = 0;
  }
  pPVar6 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).super_SegmentBaseCommon
           .allocator;
  pAVar7 = &pPVar6[-1].allocatorType;
  if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
    pAVar7 = (AllocatorType *)0x0;
  }
  if (pAVar7[0x28] < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22a,"(pageCount <= this->GetAllocator()->maxAllocPageCount)",
                       "pageCount <= this->GetAllocator()->maxAllocPageCount");
    if (!bVar3) goto LAB_006fe007;
    *puVar5 = 0;
    pPVar6 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
             super_SegmentBaseCommon.allocator;
  }
  pAVar7 = &pPVar6[-1].allocatorType;
  if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
    pAVar7 = (AllocatorType *)0x0;
  }
  if ((pAVar7[0x28] - pageCount) * 0x1000 <
      (uint)((int)address -
            *(int *)&(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22c,
                       "(((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize)"
                       ,
                       "((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize"
                      );
    if (!bVar3) goto LAB_006fe007;
    *puVar5 = 0;
  }
  bVar3 = IsFreeOrDecommitted(this,address,pageCount);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22e,"(!IsFreeOrDecommitted(address, pageCount))",
                       "!IsFreeOrDecommitted(address, pageCount)");
    if (!bVar3) goto LAB_006fe007;
    *puVar5 = 0;
  }
  BVStatic<272UL>::SetRange
            (&this->decommitPages,
             (uint)((int)address -
                   *(int *)&(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                            address) >> 0xc,pageCount);
  this->decommitPageCount = this->decommitPageCount + pageCount;
  this_01 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
             *)(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
               super_SegmentBaseCommon.allocator;
  if (this_01 !=
      (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
       *)0x0) {
    this_01 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               *)&this_01[-1].numberOfSegments;
  }
  this_00 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
            ::GetVirtualAllocator(this_01);
  PreReservedVirtualAllocWrapper::Free(this_00,address,(ulong)(pageCount << 0xc),0x4000);
  BVar1 = this->decommitPageCount;
  BVar4 = BVStatic<272UL>::Count(&this->decommitPages);
  if (BVar1 != BVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x23b,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                       "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
    if (!bVar3) {
LAB_006fe007:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void
PageSegmentBase<T>::DecommitPages(__in void * address, uint pageCount)
{
    Assert(address >= this->address);
    Assert(pageCount <= this->GetAllocator()->maxAllocPageCount);
    Assert(((uint)(((char *)address) - this->address))
      <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize);

    Assert(!IsFreeOrDecommitted(address, pageCount));
    uint base = this->GetBitRangeBase(address);

    this->SetRangeInDecommitPagesBitVector(base, pageCount);
    this->decommitPageCount += pageCount;

    if (!onlyUpdateState)
    {
#pragma warning(suppress: 6250)
        this->GetAllocator()->GetVirtualAllocator()->Free(address,
          pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
    }

    Assert(decommitPageCount == (uint)this->GetCountOfDecommitPages());
}